

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# eval.c
# Opt level: O1

sexp sexp_generate_op(sexp ctx,sexp self,sexp_sint_t n,sexp ast,sexp env)

{
  sexp psVar1;
  sexp psVar2;
  sexp psVar3;
  sexp res;
  sexp vec;
  sexp_gc_var_t __sexp_gc_preserver1;
  sexp_gc_var_t __sexp_gc_preserver3;
  sexp_gc_var_t __sexp_gc_preserver2;
  sexp local_70;
  sexp_conflict local_68;
  sexp local_60;
  sexp_gc_var_t local_58;
  sexp_gc_var_t local_48;
  sexp_gc_var_t local_38;
  
  local_68 = (sexp_conflict)0x43e;
  local_58.var = (sexp_conflict *)0x0;
  local_58.next = (sexp_gc_var_t *)0x0;
  local_60 = (sexp)0x43e;
  local_38.var = (sexp_conflict *)0x0;
  local_38.next = (sexp_gc_var_t *)0x0;
  local_70 = (sexp)0x43e;
  local_48.var = (sexp_conflict *)0x0;
  local_48.next = (sexp_gc_var_t *)0x0;
  if (((ulong)env & 3) == 0) {
    if (env->tag == 0x17) {
      env = sexp_make_eval_context(ctx,(sexp)0x0,env,0,0);
    }
    else if (env->tag != 0x24) goto LAB_0012c175;
    local_58.var = &local_68;
    local_38.next = &local_58;
    local_58.next = (ctx->value).context.saves;
    (ctx->value).context.saves = local_38.next;
    local_38.var = &local_60;
    local_48.next = &local_38;
    (ctx->value).context.saves = local_48.next;
    local_48.var = &local_70;
    (ctx->value).context.saves = &local_48;
    local_68 = env;
    sexp_free_vars(env,ast,(sexp)&DAT_0000023e);
    sexp_generate(local_68,(sexp_conflict)0x0,(sexp_conflict)0x0,(sexp_conflict)0x0,ast);
    local_70 = sexp_complete_bytecode(local_68);
    if ((((ulong)local_70 & 3) != 0) || (psVar2 = local_70, local_70->tag != 0x13)) {
      (local_68->value).port.size = 0x3e;
      psVar2 = sexp_make_vector_op(local_68,(sexp)0x0,2,(sexp)0x0,(sexp)&DAT_0000043e);
      psVar1 = local_70;
      if ((((ulong)psVar2 & 3) != 0) || (psVar2->tag != 0x13)) {
        local_60 = psVar2;
        psVar3 = sexp_alloc_tagged_aux(local_68,0x20,0x14);
        (psVar3->value).flonum_bits[0x10] = '\x01';
        (psVar3->value).procedure.num_args = 0;
        (psVar3->value).type.name = psVar1;
        (psVar3->value).type.cpl = psVar2;
        psVar2 = psVar3;
      }
    }
    local_70 = psVar2;
    (ctx->value).context.saves = local_58.next;
    return local_70;
  }
LAB_0012c175:
  psVar2 = sexp_type_exception(ctx,self,0x17,env);
  return psVar2;
}

Assistant:

sexp sexp_generate_op (sexp ctx, sexp self, sexp_sint_t n, sexp ast, sexp env) {
  sexp_gc_var3(ctx2, vec, res);
  if (sexp_contextp(env)) {
    ctx2 = env;
  } else {
    sexp_assert_type(ctx, sexp_envp, SEXP_ENV, env);
    ctx2 = sexp_make_eval_context(ctx, NULL, env, 0, 0);
  }
  sexp_gc_preserve3(ctx, ctx2, vec, res);
  sexp_free_vars(ctx2, ast, SEXP_NULL);    /* should return SEXP_NULL */
  sexp_emit_enter(ctx2);
  sexp_generate(ctx2, 0, 0, 0, ast);
  res = sexp_complete_bytecode(ctx2);
  if (!sexp_exceptionp(res)) {
    sexp_context_specific(ctx2) = SEXP_FALSE;
    vec = sexp_make_vector(ctx2, 0, SEXP_VOID);
    if (sexp_exceptionp(vec)) res = vec;
    else res = sexp_make_procedure(ctx2, SEXP_ZERO, SEXP_ZERO, res, vec);
  }
  sexp_gc_release3(ctx);
  return res;
}